

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O1

timestamp_t
duckdb::DateTrunc::
UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::SecondOperator>
          (timestamp_t input)

{
  bool bVar1;
  dtime_t dVar2;
  timestamp_t tVar3;
  undefined1 auVar4 [16];
  int32_t hour;
  date_t date;
  int32_t micros;
  int32_t sec;
  int32_t min;
  dtime_t time;
  timestamp_t local_60;
  date_t local_58;
  int local_54;
  int local_50;
  int local_4c;
  string local_48;
  
  bVar1 = duckdb::Value::IsFinite<duckdb::timestamp_t>(input);
  if (bVar1) {
    duckdb::Timestamp::Convert(input,&local_58,(dtime_t *)&local_48);
    duckdb::Time::Convert
              ((dtime_t)local_48._M_dataplus._M_p,(int *)&local_60,&local_4c,&local_50,&local_54);
    dVar2.micros = duckdb::Time::FromTime((int)local_60.value,local_4c,local_50,0);
    tVar3.value = duckdb::Timestamp::FromDatetime(local_58,dVar2);
  }
  else {
    bVar1 = duckdb::TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>
                      (input,&local_60,false);
    if (!bVar1) {
      auVar4 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
                (&local_48,(duckdb *)input.value,(timestamp_t)auVar4._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar4._0_8_,(string *)&local_48);
      __cxa_throw(auVar4._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    tVar3.value = CONCAT44(local_60.value._4_4_,(int)local_60.value);
  }
  return (timestamp_t)tVar3.value;
}

Assistant:

static inline TR UnaryFunction(TA input) {
		if (Value::IsFinite(input)) {
			return OP::template Operation<TA, TR>(input);
		} else {
			return Cast::template Operation<TA, TR>(input);
		}
	}